

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

reference __thiscall
slang::SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>::
emplace_back<slang::ast::PortSymbol::NetTypeRange>
          (SmallVectorBase<slang::ast::PortSymbol::NetTypeRange> *this,NetTypeRange *args)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  size_type sVar3;
  ulong uVar4;
  pointer p;
  undefined8 uVar5;
  pointer pNVar6;
  pointer pNVar7;
  bitwidth_t bVar8;
  undefined4 uVar9;
  pointer pNVar10;
  long lVar11;
  long lVar12;
  pointer __src;
  ulong uVar13;
  long lVar14;
  
  __src = this->data_ + this->len;
  if (this->len != this->cap) {
    bVar8 = args->width;
    uVar9 = *(undefined4 *)&args->field_0xc;
    __src->netType = args->netType;
    __src->width = bVar8;
    *(undefined4 *)&__src->field_0xc = uVar9;
    sVar3 = this->len;
    this->len = sVar3 + 1;
    return this->data_ + sVar3;
  }
  if (this->len == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar13 = this->len + 1;
  uVar4 = this->cap;
  if (uVar13 < uVar4 * 2) {
    uVar13 = uVar4 * 2;
  }
  if (0x7ffffffffffffff - uVar4 < uVar4) {
    uVar13 = 0x7ffffffffffffff;
  }
  lVar14 = (long)__src - (long)this->data_;
  pNVar10 = (pointer)operator_new(uVar13 << 4);
  uVar5 = *(undefined8 *)&args->width;
  *(undefined8 *)((long)pNVar10 + lVar14) = args->netType;
  ((undefined8 *)((long)pNVar10 + lVar14))[1] = uVar5;
  p = this->data_;
  lVar11 = this->len * 0x10;
  lVar12 = (long)p + (lVar11 - (long)__src);
  pNVar6 = p;
  pNVar7 = pNVar10;
  if (lVar12 == 0) {
    if (this->len != 0) {
      lVar12 = 0;
      do {
        puVar1 = (undefined8 *)((long)&p->netType + lVar12);
        uVar5 = puVar1[1];
        puVar2 = (undefined8 *)((long)&pNVar10->netType + lVar12);
        *puVar2 = *puVar1;
        puVar2[1] = uVar5;
        lVar12 = lVar12 + 0x10;
      } while (lVar11 != lVar12);
    }
  }
  else {
    for (; pNVar6 != __src; pNVar6 = pNVar6 + 1) {
      bVar8 = pNVar6->width;
      uVar9 = *(undefined4 *)&pNVar6->field_0xc;
      pNVar7->netType = pNVar6->netType;
      pNVar7->width = bVar8;
      *(undefined4 *)&pNVar7->field_0xc = uVar9;
      pNVar7 = pNVar7 + 1;
    }
    memcpy((void *)((long)pNVar10 + lVar14 + 0x10),__src,
           (lVar12 - 0x10U & 0xfffffffffffffff0) + 0x10);
  }
  if (p != (pointer)this->firstElement) {
    operator_delete(p);
  }
  this->len = this->len + 1;
  this->cap = uVar13;
  this->data_ = pNVar10;
  return (reference)((long)pNVar10 + lVar14);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }